

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClau.c
# Opt level: O3

int Fra_ClauCheckClause(Cla_Man_t *p,Vec_Int_t *vClause,Vec_Int_t *vCex)

{
  lit *plVar1;
  int *piVar2;
  int iVar3;
  long lVar4;
  Vec_Int_t *pVVar5;
  long lVar6;
  int iVar7;
  
  iVar3 = p->nSatVarsTestCur;
  p->nSatVarsTestCur = iVar3 + 1;
  Vec_IntPush(vClause,iVar3 * 2);
  lVar6 = (long)vClause->nSize;
  plVar1 = vClause->pArray;
  if (0 < lVar6) {
    lVar4 = 0;
    do {
      *(byte *)(plVar1 + lVar4) = *(byte *)(plVar1 + lVar4) ^ 1;
      lVar4 = lVar4 + 1;
      lVar6 = (long)vClause->nSize;
    } while (lVar4 < lVar6);
  }
  iVar3 = sat_solver_addclause(p->pSatTest,plVar1,plVar1 + lVar6);
  if (iVar3 == 1) {
    if (vClause->nSize < 1) {
      __assert_fail("p->nSize > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x3b1,"int Vec_IntPop(Vec_Int_t *)");
    }
    piVar2 = vClause->pArray;
    iVar3 = vClause->nSize + -1;
    vClause->nSize = iVar3;
    if (iVar3 != 0) {
      lVar6 = 0;
      do {
        *(byte *)(piVar2 + lVar6) = *(byte *)(piVar2 + lVar6) ^ 1;
        lVar6 = lVar6 + 1;
      } while (lVar6 < vClause->nSize);
    }
    Fra_ClauRemapClause(p->pMapCsTestToNsTest,vClause,p->vCexAssm,0);
    iVar3 = p->nSatVarsTestBeg;
    if (iVar3 < p->nSatVarsTestCur + -1) {
      iVar7 = iVar3 * 2 + 1;
      do {
        Vec_IntPush(p->vCexAssm,iVar7);
        iVar3 = iVar3 + 1;
        iVar7 = iVar7 + 2;
      } while (iVar3 < p->nSatVarsTestCur + -1);
    }
    Vec_IntPush(p->vCexAssm,iVar3 * 2);
    plVar1 = p->vCexAssm->pArray;
    iVar3 = sat_solver_solve(p->pSatTest,plVar1,plVar1 + p->vCexAssm->nSize,0,0,0,0);
    if (vCex != (Vec_Int_t *)0x0) {
      vCex->nSize = 0;
    }
    iVar7 = 1;
    if (iVar3 != -1) {
      if (iVar3 != 1) {
        __assert_fail("RetValue == l_True",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClau.c"
                      ,0x1c3,"int Fra_ClauCheckClause(Cla_Man_t *, Vec_Int_t *, Vec_Int_t *)");
      }
      iVar7 = 0;
      if ((vCex != (Vec_Int_t *)0x0) && (pVVar5 = p->vSatVarsTestCs, iVar7 = 0, 0 < pVVar5->nSize))
      {
        iVar7 = 0;
        lVar6 = 0;
        do {
          iVar3 = sat_solver_var_literal(p->pSatTest,pVVar5->pArray[lVar6]);
          Vec_IntPush(vCex,iVar3);
          lVar6 = lVar6 + 1;
          pVVar5 = p->vSatVarsTestCs;
        } while (lVar6 < pVVar5->nSize);
      }
    }
    return iVar7;
  }
  __assert_fail("RetValue == 1",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClau.c"
                ,0x1b2,"int Fra_ClauCheckClause(Cla_Man_t *, Vec_Int_t *, Vec_Int_t *)");
}

Assistant:

int Fra_ClauCheckClause( Cla_Man_t * p, Vec_Int_t * vClause, Vec_Int_t * vCex )
{
    int nBTLimit = 0;
    int RetValue, iVar, i;
    // complement literals
    Vec_IntPush( vClause, toLit( p->nSatVarsTestCur++ ) ); // helper positive
    Vec_IntComplement( vClause ); // helper negative (the clause is C v h')
    // add the clause
    RetValue = sat_solver_addclause( p->pSatTest, Vec_IntArray(vClause), Vec_IntArray(vClause) + Vec_IntSize(vClause) );
    assert( RetValue == 1 );
    // complement all literals
    Vec_IntPop( vClause );  // helper removed
    Vec_IntComplement( vClause ); 
    // create the assumption in terms of NS variables
    Fra_ClauRemapClause( p->pMapCsTestToNsTest, vClause, p->vCexAssm, 0 );
    // add helper literals
    for ( i = p->nSatVarsTestBeg; i < p->nSatVarsTestCur - 1; i++ )
        Vec_IntPush( p->vCexAssm, toLitCond(i,1) ); // other helpers negative
    Vec_IntPush( p->vCexAssm, toLitCond(i,0) ); // positive helper
    // try to solve
    RetValue = sat_solver_solve( p->pSatTest, Vec_IntArray(p->vCexAssm), Vec_IntArray(p->vCexAssm) + Vec_IntSize(p->vCexAssm), 
        (ABC_INT64_T)nBTLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    if ( vCex )
        Vec_IntClear( vCex );
    if ( RetValue == l_False )
        return 1;
    assert( RetValue == l_True );
    if ( vCex )
    {
        Vec_IntForEachEntry( p->vSatVarsTestCs, iVar, i )
            Vec_IntPush( vCex, sat_solver_var_literal(p->pSatTest, iVar) );
    }
    return 0;
}